

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

void processColumnNoise(double *out,SeaLevelColumnNoiseBeta *src,double *climate)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = src->contBSample / 8000.0;
  dVar5 = 0.0;
  dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar3 |
                  (ulong)(dVar3 * -0.3) & -(ulong)(dVar3 < 0.0)) * 3.0 + -2.0;
  if (0.0 <= dVar3) {
    dVar5 = 1.0 - *climate * climate[1];
    dVar5 = dVar5 * dVar5;
    dVar6 = (1.0 - dVar5 * dVar5) * (src->contASample + 256.0) * 0.001953125;
    dVar5 = 1.0;
    if (dVar6 <= 1.0) {
      dVar5 = dVar6;
    }
    uVar4 = ~-(ulong)(1.0 < dVar3) & (ulong)(dVar3 * 0.125);
    uVar2 = -(ulong)(1.0 < dVar3) & 0x3fc0000000000000;
  }
  else {
    uVar2 = -(ulong)(dVar3 * 0.5 < -1.0);
    uVar4 = ~uVar2 & (ulong)(((dVar3 * 0.5) / 1.4) * 0.5);
    uVar2 = uVar2 & 0xbfd6db6db6db6db7;
  }
  lVar1 = 0;
  do {
    dVar6 = (((double)((int)lVar1 + 7) - ((double)(uVar2 | uVar4) * 17.0 * 0.0625 * 4.0 + 8.5)) *
            12.0) / (double)(-(ulong)(dVar5 < 0.0) & 0x3fe0000000000000 |
                            ~-(ulong)(dVar5 < 0.0) & (ulong)(dVar5 + 0.5));
    dVar7 = src->minSample[lVar1] * 0.001953125;
    dVar8 = (src->mainSample[lVar1] / 10.0 + 1.0) * 0.5;
    dVar3 = dVar7;
    if ((0.0 <= dVar8) && (dVar3 = src->maxSample[lVar1] * 0.001953125, dVar8 <= 1.0)) {
      dVar3 = dVar7 + (dVar3 - dVar7) * dVar8;
    }
    out[lVar1] = dVar3 - (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                                 (ulong)(dVar6 * 4.0) & -(ulong)(dVar6 < 0.0));
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

static void processColumnNoise(double *out, const SeaLevelColumnNoiseBeta *src,
    const double climate[2])
{
    double humi = 1 - climate[0] * climate[1];
    humi *= humi;
    humi *= humi;
    humi = 1 - humi;
    double contA = (src->contASample + 256) / 512 * humi;
    contA = (contA > 1) ? 1.0 : contA;
    double contB = src->contBSample / 8000;
    if (contB < 0)
        contB = -contB * 0.3;
    contB = contB*3-2;
    if (contB < 0)
    {
        contB /= 2;
        contB = (contB < -1) ? -1.0 / 1.4 / 2 : contB / 1.4 / 2;
        contA = 0;
    }
    else
    {
        contB = (contB > 1) ? 1.0/8 : contB/8;
    }
    contA = (contA < 0) ? 0.5 : contA+0.5;
    contB = (contB * 17.0) / 16;
    contB = 17.0 / 2 + contB * 4;
    const double *low = src->minSample;
    const double *high = src->maxSample;
    const double *selector = src->mainSample;
    int i;
    for (i = 0; i <= 1; i++)
    {
        double chooseLHS;
        double procCont = ((i + 7 - contB) * 12) / contA;
        procCont = (procCont < 0) ? procCont*4 : procCont;
        double lSample = low[i] / 512;
        double hSample = high[i] / 512;
        double sSample = (selector[i] / 10 + 1) / 2;
        chooseLHS = (sSample < 0.0) ? lSample : (sSample > 1) ? hSample :
            lSample + (hSample - lSample) * sSample;
        chooseLHS -= procCont;
        out[i] = chooseLHS;
    }
}